

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy_io.c
# Opt level: O1

int http_proxy_io_send(CONCRETE_IO_HANDLE http_proxy_io,void *buffer,size_t size,
                      ON_SEND_COMPLETE on_send_complete,void *on_send_complete_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  HTTP_PROXY_IO_INSTANCE *http_proxy_io_instance;
  
  if ((buffer == (void *)0x0 || http_proxy_io == (CONCRETE_IO_HANDLE)0x0) || size == 0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x358;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/http_proxy_io.c"
              ,"http_proxy_io_send",0x35a,1,"Bad arguments: http_proxy_io = %p, buffer = %p.",
              http_proxy_io,buffer);
    return 0x358;
  }
  if (*http_proxy_io == 3) {
    iVar1 = xio_send(*(XIO_HANDLE *)((long)http_proxy_io + 0x78),buffer,size,on_send_complete,
                     on_send_complete_context);
    if (iVar1 == 0) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x36d;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x36d;
    }
    pcVar4 = "Underlying xio_send failed.";
    iVar3 = 0x36e;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x364;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x364;
    }
    pcVar4 = "Invalid HTTP proxy IO state. Expected state is HTTP_PROXY_IO_STATE_OPEN.";
    iVar3 = 0x365;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/http_proxy_io.c"
            ,"http_proxy_io_send",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

static int http_proxy_io_send(CONCRETE_IO_HANDLE http_proxy_io, const void* buffer, size_t size, ON_SEND_COMPLETE on_send_complete, void* on_send_complete_context)
{
    int result;

    /* Codes_SRS_HTTP_PROXY_IO_01_032: [ on_send_complete shall be allowed to be NULL. ]*/
    /* Codes_SRS_HTTP_PROXY_IO_01_030: [ If any of the arguments http_proxy_io or buffer is NULL, http_proxy_io_send shall fail and return a non-zero value. ]*/
    if ((http_proxy_io == NULL) ||
        (buffer == NULL) ||
        /* Codes_SRS_HTTP_PROXY_IO_01_031: [ If size is 0, http_proxy_io_send shall fail and return a non-zero value. ]*/
        (size == 0))
    {
        result = __LINE__;
        LogError("Bad arguments: http_proxy_io = %p, buffer = %p.",
            http_proxy_io, buffer);
    }
    else
    {
        HTTP_PROXY_IO_INSTANCE* http_proxy_io_instance = (HTTP_PROXY_IO_INSTANCE*)http_proxy_io;

        /* Codes_SRS_HTTP_PROXY_IO_01_034: [ If http_proxy_io_send is called when the IO is not open, http_proxy_io_send shall fail and return a non-zero value. ]*/
        /* Codes_SRS_HTTP_PROXY_IO_01_035: [ If the IO is in an error state (an error was reported through the on_io_error callback), http_proxy_io_send shall fail and return a non-zero value. ]*/
        if (http_proxy_io_instance->http_proxy_io_state != HTTP_PROXY_IO_STATE_OPEN)
        {
            result = __LINE__;
            LogError("Invalid HTTP proxy IO state. Expected state is HTTP_PROXY_IO_STATE_OPEN.");
        }
        else
        {
            /* Codes_SRS_HTTP_PROXY_IO_01_033: [ http_proxy_io_send shall send the bytes by calling xio_send on the underlying IO created in http_proxy_io_create and passing buffer and size as arguments. ]*/
            if (xio_send(http_proxy_io_instance->underlying_io, buffer, size, on_send_complete, on_send_complete_context) != 0)
            {
                /* Codes_SRS_HTTP_PROXY_IO_01_055: [ If xio_send fails, http_proxy_io_send shall fail and return a non-zero value. ]*/
                result = __LINE__;
                LogError("Underlying xio_send failed.");
            }
            else
            {
                /* Codes_SRS_HTTP_PROXY_IO_01_029: [ http_proxy_io_send shall send the size bytes pointed to by buffer and on success it shall return 0. ]*/
                result = 0;
            }
        }
    }

    return result;
}